

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O3

list<int,_ft::allocator<int>_> * __thiscall
ft::list<int,_ft::allocator<int>_>::operator=
          (list<int,_ft::allocator<int>_> *this,list<int,_ft::allocator<int>_> *rhs)

{
  constListIterator<int> local_30;
  constListIterator<int> local_20;
  
  if (rhs != this) {
    local_30.super_listIterator<int>.m_node = rhs->m_head->next;
    local_30.super_listIterator<int>._vptr_listIterator = (_func_int **)&PTR__listIterator_0010dd48;
    local_20.super_listIterator<int>.m_node = rhs->m_tail;
    local_20.super_listIterator<int>._vptr_listIterator = (_func_int **)&PTR__listIterator_0010dd48;
    list<int,ft::allocator<int>>::assign<ft::constListIterator<int>>
              ((list<int,ft::allocator<int>> *)this,&local_30,&local_20,(type *)0x0);
  }
  return this;
}

Assistant:

list&	operator=(list const & rhs) {
		if (&rhs != this) {
			this->m_alloc = rhs.get_allocator();
			this->assign(rhs.begin(), rhs.end());
		}
		return *this;
	}